

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThreeGeneric::ChConstraintThreeGeneric
          (ChConstraintThreeGeneric *this,ChVariables *mvariables_a,ChVariables *mvariables_b,
          ChVariables *mvariables_c)

{
  undefined1 auVar1 [64];
  
  (this->super_ChConstraintThree).super_ChConstraint.valid = false;
  (this->super_ChConstraintThree).super_ChConstraint.disabled = false;
  (this->super_ChConstraintThree).super_ChConstraint.redundant = false;
  (this->super_ChConstraintThree).super_ChConstraint.broken = false;
  (this->super_ChConstraintThree).super_ChConstraint.c_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.l_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.b_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.cfm_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.active = true;
  (this->super_ChConstraintThree).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->super_ChConstraintThree).super_ChConstraint.g_i = 0.0;
  (this->super_ChConstraintThree).variables_c = (ChVariables *)0x0;
  (this->super_ChConstraintThree).variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChConstraintThree).variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8);
  auVar1 = ZEXT464(0) << 0x40;
  (this->super_ChConstraintThree).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintThreeGeneric_00b3b2e0;
  this->Cq_a = (ChRowVectorDynamic<double>)auVar1._0_16_;
  this->Cq_b = (ChRowVectorDynamic<double>)auVar1._16_16_;
  this->Cq_c = (ChRowVectorDynamic<double>)auVar1._32_16_;
  this->Eq_a = (ChVectorDynamic<double>)auVar1._48_16_;
  this->Cq_c = (ChRowVectorDynamic<double>)auVar1._0_16_;
  this->Eq_a = (ChVectorDynamic<double>)auVar1._16_16_;
  this->Eq_b = (ChVectorDynamic<double>)auVar1._32_16_;
  this->Eq_c = (ChVectorDynamic<double>)auVar1._48_16_;
  SetVariables(this,mvariables_a,mvariables_b,mvariables_c);
  return;
}

Assistant:

ChConstraintThreeGeneric::ChConstraintThreeGeneric(ChVariables* mvariables_a,
                                                   ChVariables* mvariables_b,
                                                   ChVariables* mvariables_c) {
    SetVariables(mvariables_a, mvariables_b, mvariables_c);
}